

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O1

void sptk::world::anon_unknown_0::GetWindowedWaveform
               (double *x,int x_length,int fs,double current_f0,double current_position,
               int window_type,double window_length_ratio,double *waveform,RandnState *randn_state)

{
  bool bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  
  dVar16 = (double)fs;
  uVar5 = matlab_round(((dVar16 * window_length_ratio) / current_f0) * 0.5);
  uVar2 = uVar5 * 2;
  lVar13 = (long)(int)(uVar5 * 2 + 1);
  uVar15 = lVar13 * 4;
  uVar14 = lVar13 << 3;
  if ((int)uVar5 < 0) {
    uVar15 = 0xffffffffffffffff;
    uVar14 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar15);
  pvVar8 = operator_new__(uVar15);
  pvVar9 = operator_new__(uVar14);
  auVar4 = _DAT_00118a10;
  auVar3 = _DAT_00118a00;
  if (-1 < (int)uVar5) {
    auVar19._4_4_ = 0;
    auVar19._0_4_ = uVar2;
    auVar19._8_4_ = uVar2;
    auVar19._12_4_ = 0;
    lVar13 = (ulong)uVar5 * 4 + (long)(int)uVar5 * -4;
    lVar11 = 0;
    auVar19 = auVar19 ^ _DAT_00118a10;
    do {
      iVar12 = (int)lVar11;
      auVar20._8_4_ = iVar12;
      auVar20._0_8_ = lVar11;
      auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar20 = (auVar20 | auVar3) ^ auVar4;
      bVar1 = auVar19._0_4_ < auVar20._0_4_;
      iVar6 = auVar19._4_4_;
      iVar21 = auVar20._4_4_;
      if ((bool)(~(iVar6 < iVar21 || iVar21 == iVar6 && bVar1) & 1)) {
        *(uint *)((long)pvVar7 + lVar11 * 4 + lVar13) = -uVar5 + iVar12;
      }
      if (iVar6 >= iVar21 && (iVar21 != iVar6 || !bVar1)) {
        *(uint *)((long)pvVar7 + lVar11 * 4 + lVar13 + 4) = -uVar5 + iVar12 + 1;
      }
      lVar11 = lVar11 + 2;
    } while ((ulong)uVar2 + 2 != lVar11);
  }
  iVar6 = matlab_round(current_position * dVar16 + 0.001);
  if (-1 < (int)uVar5) {
    uVar10 = 0;
    if (0 < (int)uVar2) {
      uVar10 = uVar2;
    }
    uVar15 = 0;
    do {
      iVar12 = *(int *)((long)pvVar7 + uVar15 * 4) + iVar6;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      if (x_length + -1 < iVar12) {
        iVar12 = x_length + -1;
      }
      *(int *)((long)pvVar8 + uVar15 * 4) = iVar12;
      uVar15 = uVar15 + 1;
    } while ((uVar10 | 1) != uVar15);
  }
  if (window_type == 1) {
    if (-1 < (int)uVar5) {
      uVar15 = 0;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = uVar2;
      }
      do {
        dVar17 = (double)*(int *)((long)pvVar7 + uVar15 * 4);
        dVar17 = cos((((dVar17 + dVar17) / window_length_ratio) / dVar16) * 3.141592653589793 *
                     current_f0);
        *(double *)((long)pvVar9 + uVar15 * 8) = dVar17 * 0.5 + 0.5;
        uVar15 = uVar15 + 1;
      } while ((uVar5 | 1) != uVar15);
    }
  }
  else if (-1 < (int)uVar5) {
    uVar15 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = uVar2;
    }
    do {
      dVar17 = (double)*(int *)((long)pvVar7 + uVar15 * 4);
      dVar17 = (((dVar17 + dVar17) / window_length_ratio) / dVar16) * 3.141592653589793 * current_f0
      ;
      dVar18 = cos(dVar17);
      dVar17 = cos(dVar17 + dVar17);
      *(double *)((long)pvVar9 + uVar15 * 8) = dVar17 * 0.08 + dVar18 * 0.5 + 0.42;
      uVar15 = uVar15 + 1;
    } while ((uVar5 | 1) != uVar15);
  }
  if (-1 < (int)uVar2) {
    lVar13 = 0;
    do {
      dVar16 = x[*(int *)((long)pvVar8 + lVar13 * 4)];
      dVar17 = *(double *)((long)pvVar9 + lVar13 * 8);
      dVar18 = randn(randn_state);
      waveform[lVar13] = dVar18 * 1e-06 + dVar16 * dVar17;
      lVar13 = lVar13 + 1;
    } while ((ulong)uVar2 + 1 != lVar13);
  }
  if ((int)uVar2 < 0) {
    dVar16 = NAN;
  }
  else {
    dVar17 = 0.0;
    uVar15 = 0;
    dVar16 = 0.0;
    do {
      dVar16 = dVar16 + waveform[uVar15];
      dVar17 = dVar17 + *(double *)((long)pvVar9 + uVar15 * 8);
      uVar15 = uVar15 + 1;
    } while ((uVar2 | 1) != uVar15);
    dVar16 = dVar16 / dVar17;
  }
  if (-1 < (int)uVar2) {
    uVar15 = 0;
    do {
      waveform[uVar15] = waveform[uVar15] - *(double *)((long)pvVar9 + uVar15 * 8) * dVar16;
      uVar15 = uVar15 + 1;
    } while ((uVar2 | 1) != uVar15);
  }
  operator_delete__(pvVar7);
  operator_delete__(pvVar8);
  operator_delete__(pvVar9);
  return;
}

Assistant:

static void GetWindowedWaveform(const double *x, int x_length, int fs,
    double current_f0, double current_position, int window_type,
    double window_length_ratio, double *waveform, RandnState *randn_state) {
  int half_window_length =
    matlab_round(window_length_ratio * fs / current_f0 / 2.0);

  int *base_index = new int[half_window_length * 2 + 1];
  int *safe_index = new int[half_window_length * 2 + 1];
  double *window  = new double[half_window_length * 2 + 1];

  SetParametersForGetWindowedWaveform(half_window_length, x_length,
      current_position, fs, current_f0, window_type, window_length_ratio,
      base_index, safe_index, window);

  // F0-adaptive windowing
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] =
      x[safe_index[i]] * window[i] + randn(randn_state) * world::kSafeGuardD4C;

  double tmp_weight1 = 0;
  double tmp_weight2 = 0;
  for (int i = 0; i <= half_window_length * 2; ++i) {
    tmp_weight1 += waveform[i];
    tmp_weight2 += window[i];
  }
  double weighting_coefficient = tmp_weight1 / tmp_weight2;
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] -= window[i] * weighting_coefficient;

  delete[] base_index;
  delete[] safe_index;
  delete[] window;
}